

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.cpp
# Opt level: O2

QNativeIpcKey *
QtIpcCommon::platformSafeKey
          (QNativeIpcKey *__return_storage_ptr__,QString *key,IpcType ipcType,Type type)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->key).d.size = 0;
  __return_storage_ptr__->d = (QNativeIpcKeyPrivate *)0x0;
  (__return_storage_ptr__->key).d.d = (Data *)0x0;
  (__return_storage_ptr__->typeAndFlags).type = type;
  (__return_storage_ptr__->typeAndFlags).reserved1 = 0;
  (__return_storage_ptr__->typeAndFlags).reserved2 = 0;
  if (((key->d).size != 0) && (type != Windows)) {
    if (type == PosixRealtime) {
      local_70.d._0_2_ = 0x2f;
      local_70.ptr = (char16_t *)key;
      QStringBuilder<char16_t,_const_QString_&>::convertTo<QString>
                ((QString *)&local_58,(QStringBuilder<char16_t,_const_QString_&> *)&local_70);
      QNativeIpcKey::setNativeKey(__return_storage_ptr__,(QString *)&local_58);
    }
    else {
      bVar1 = QString::startsWith(key,(QChar)0x2f,CaseSensitive);
      if (bVar1) {
        QNativeIpcKey::setNativeKey(__return_storage_ptr__,key);
        goto LAB_0020b01c;
      }
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QStandardPaths::writableLocation((QString *)&local_58,RuntimeLocation);
      local_38.a.b = L'/';
      local_38.a.a = (QString *)&local_58;
      local_38.b = key;
      QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                ((QString *)&local_70,&local_38);
      QNativeIpcKey::setNativeKey(__return_storage_ptr__,(QString *)&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
LAB_0020b01c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QNativeIpcKey QtIpcCommon::platformSafeKey(const QString &key, QtIpcCommon::IpcType ipcType,
                                           QNativeIpcKey::Type type)
{
    QNativeIpcKey k(type);
    if (key.isEmpty())
        return k;

    switch (type) {
    case QNativeIpcKey::Type::PosixRealtime:
        if (isIpcSupported(ipcType, QNativeIpcKey::Type::PosixRealtime)) {
#ifdef SHM_NAME_MAX
            // The shared memory name limit on Apple platforms is very low (30
            // characters), so we have to cut it down to avoid ENAMETOOLONG. We
            // hope that there won't be too many collisions...
            k.setNativeKey(u'/' + QStringView(key).left(SHM_NAME_MAX - 1));
#else
            k.setNativeKey(u'/' + key);
#endif
        }
        return k;

    case QNativeIpcKey::Type::Windows:
        if (isIpcSupported(ipcType, QNativeIpcKey::Type::Windows)) {
            QStringView prefix;
            QStringView payload = key;
            // see https://learn.microsoft.com/en-us/windows/win32/termserv/kernel-object-namespaces
            for (QStringView candidate : { u"Local\\"_sv, u"Global\\"_sv }) {
                if (!key.startsWith(candidate))
                    continue;
                prefix = candidate;
                payload = payload.sliced(prefix.size());
                break;
            }

            QStringView mid;
            switch (ipcType) {
            case IpcType::SharedMemory:     mid = u"shm_"; break;
            case IpcType::SystemSemaphore:  mid = u"sem_"; break;
            }

            QString result = prefix + mid + payload;
#ifdef Q_OS_WINDOWS
            result.truncate(MAX_PATH);
#endif
            k.setNativeKey(result);
        }
        return k;

    case QNativeIpcKey::Type::SystemV:
        break;
    }

    // System V
    if (isIpcSupported(ipcType, QNativeIpcKey::Type::SystemV)) {
        if (key.startsWith(u'/')) {
            k.setNativeKey(key);
        } else {
            QString baseDir = QStandardPaths::writableLocation(QStandardPaths::RuntimeLocation);
            k.setNativeKey(baseDir + u'/' + key);
        }
    }
    return k;
}